

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QDockAreaLayoutItem *item)

{
  Alignment *pAVar1;
  QLayoutItem *pQVar2;
  long in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QDebugStateSaver saver;
  undefined1 local_58 [8];
  QDockAreaLayoutInfo *local_50;
  QPlaceHolderItem *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)item);
  pQVar2 = item->widgetItem;
  *(undefined1 *)&pQVar2[3]._vptr_QLayoutItem = 0;
  if (in_RDX == 0) {
    QVar3.m_data = (storage_type *)0x18;
    QVar3.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<((QTextStream *)pQVar2,(QString *)local_48);
    if (local_48[0] != (QPlaceHolderItem *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(local_48[0]->objectName).d.d)->_M_i =
           ((__atomic_base<int> *)&(local_48[0]->objectName).d.d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(local_48[0]->objectName).d.d)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0],2,0x10);
      }
    }
    if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
      QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
    }
    pQVar2 = item->widgetItem;
    *(QLayoutItem **)dbg.stream = pQVar2;
    pAVar1 = &pQVar2[2].align;
    (pAVar1->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).super_QFlagsStorage<Qt::AlignmentFlag>
    .i = (pAVar1->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
         super_QFlagsStorage<Qt::AlignmentFlag>.i + 1;
  }
  else {
    pQVar2[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         pQVar2[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i + 1;
    local_58 = (undefined1  [8])pQVar2;
    operator<<(dbg,(QDockAreaLayoutItem *)local_58);
  }
  if (in_RDX != 0) {
    QDebug::~QDebug((QDebug *)local_58);
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QDockAreaLayoutItem *item)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    return item ? dbg << *item : dbg << "QDockAreaLayoutItem(0x0)";
}